

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_value.cpp
# Opt level: O2

void duckdb::ArrayValueFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  long lVar1;
  ulong uVar2;
  reference pvVar3;
  Vector *vector;
  idx_t i;
  ulong uVar4;
  long lVar5;
  long lVar6;
  LogicalType array_type;
  Value local_b0 [64];
  Value val;
  
  duckdb::LogicalType::LogicalType(&array_type,(LogicalType *)(result + 8));
  duckdb::ArrayType::GetChildType(&array_type);
  duckdb::Vector::SetVectorType((VectorType)result);
  for (uVar4 = 0; uVar2 = (*(long *)(args + 8) - *(long *)args) / 0x68, uVar4 < uVar2;
      uVar4 = uVar4 + 1) {
    pvVar3 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,uVar4);
    if (*pvVar3 != (value_type)0x2) {
      duckdb::Vector::SetVectorType((VectorType)result);
    }
  }
  lVar1 = *(long *)(args + 0x18);
  vector = (Vector *)duckdb::ArrayVector::GetEntry(result);
  if (1 < uVar2) {
    FlatVector::VerifyFlatVector(vector);
    duckdb::ValidityMask::Resize((ulong)(vector + 0x28));
  }
  lVar5 = 0;
  for (lVar6 = 0; lVar6 != lVar1; lVar6 = lVar6 + 1) {
    for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      duckdb::DataChunk::GetValue((ulong)local_b0,(ulong)args);
      duckdb::Value::DefaultCastAs((LogicalType *)&val,SUB81(local_b0,0));
      duckdb::Value::~Value(local_b0);
      duckdb::Vector::SetValue((ulong)vector,(Value *)(uVar4 + lVar5));
      duckdb::Value::~Value(&val);
    }
    lVar5 = lVar5 + uVar2;
  }
  duckdb::Vector::Verify((ulong)result);
  duckdb::LogicalType::~LogicalType(&array_type);
  return;
}

Assistant:

static void ArrayValueFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto array_type = result.GetType();

	D_ASSERT(array_type.id() == LogicalTypeId::ARRAY);
	D_ASSERT(args.ColumnCount() == ArrayType::GetSize(array_type));

	auto &child_type = ArrayType::GetChildType(array_type);

	result.SetVectorType(VectorType::CONSTANT_VECTOR);
	for (idx_t i = 0; i < args.ColumnCount(); i++) {
		if (args.data[i].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::FLAT_VECTOR);
		}
	}

	auto num_rows = args.size();
	auto num_columns = args.ColumnCount();

	auto &child = ArrayVector::GetEntry(result);

	if (num_columns > 1) {
		// Ensure that the child has a validity mask of the correct size
		// The SetValue call below expects the validity mask to be initialized
		auto &child_validity = FlatVector::Validity(child);
		child_validity.Resize(num_rows * num_columns);
	}

	for (idx_t i = 0; i < num_rows; i++) {
		for (idx_t j = 0; j < num_columns; j++) {
			auto val = args.GetValue(j, i).DefaultCastAs(child_type);
			child.SetValue((i * num_columns) + j, val);
		}
	}

	result.Verify(args.size());
}